

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::evaluateConstraints
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraints)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  ostream *poVar8;
  pointer ppVar9;
  char *pcVar10;
  element_type *this_00;
  size_t sVar11;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
  *this_01;
  VectorDynSize *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_XMM0_Qa;
  ostringstream errorMsg_1;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffb28;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  *in_stack_fffffffffffffb30;
  vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
  *in_stack_fffffffffffffb38;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
  *in_stack_fffffffffffffb40;
  ostringstream *this_02;
  VectorDynSize *in_stack_fffffffffffffb48;
  double in_stack_fffffffffffffb50;
  ConstraintsGroupPimpl *in_stack_fffffffffffffb58;
  string local_398 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_378;
  ostringstream local_370 [392];
  string local_1e8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_1c8;
  ostringstream local_1b0 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_38;
  VectorDynSize *local_30;
  undefined8 local_28;
  undefined8 local_20;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = isAnyTimeGroup((ConstraintsGroup *)in_stack_fffffffffffffb58);
  if (bVar1) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                  *)in_stack_fffffffffffffb28);
    ppVar9 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                           *)0x396edd);
    std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
              (&(ppVar9->second).
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
              );
    peVar6 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x396ef1);
    iVar2 = (*peVar6->_vptr_Constraint[3])(local_18,peVar6,local_20,local_28,local_30);
    if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
      uVar4 = iDynTree::VectorDynSize::size();
      if (*(uint *)(*in_RDI + 0x278) < uVar4) {
        std::__cxx11::ostringstream::ostringstream(local_1b0);
        poVar8 = std::operator<<((ostream *)local_1b0,"Constraint named ");
        local_1c8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                      *)in_stack_fffffffffffffb28);
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                               *)0x396fa0);
        poVar8 = std::operator<<(poVar8,(string *)ppVar9);
        std::operator<<(poVar8,"output a vector bigger than the specified size.");
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("ConstraintsGroup","evaluateConstraints",pcVar10);
        std::__cxx11::string::~string(local_1e8);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1b0);
      }
      else {
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    uVar4 = iDynTree::VectorDynSize::size();
    if (uVar4 < *(uint *)(*in_RDI + 0x278)) {
      iDynTree::VectorDynSize::resize((ulong)local_30);
    }
    ConstraintsGroupPimpl::findActiveConstraint(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50)
    ;
    std::
    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
    ::rend(in_stack_fffffffffffffb38);
    bVar1 = std::operator==(in_stack_fffffffffffffb40,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                             *)in_stack_fffffffffffffb38);
    if (bVar1) {
      iDynTree::VectorDynSize::zero();
      local_1 = 1;
    }
    else {
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffffb30)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var5);
      peVar6 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x397146);
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffffb30)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar7 = std::
               __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
               get(p_Var5);
      uVar3 = (*peVar6->_vptr_Constraint[3])
                        (local_18,peVar6,local_20,local_28,&peVar7->constraintBuffer);
      if ((uVar3 & 1) == 0) {
        local_1 = 0;
      }
      else {
        p_Var5 = &std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                *)in_stack_fffffffffffffb30)->
                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
        get(p_Var5);
        uVar4 = iDynTree::VectorDynSize::size();
        if (*(uint *)(*in_RDI + 0x278) < uVar4) {
          this_02 = local_370;
          std::__cxx11::ostringstream::ostringstream(this_02);
          poVar8 = std::operator<<((ostream *)this_02,"Constraint named ");
          local_378._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                        *)in_stack_fffffffffffffb28);
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                                 *)0x397240);
          poVar8 = std::operator<<(poVar8,(string *)ppVar9);
          std::operator<<(poVar8,"output a vector bigger than the specified size.");
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("ConstraintsGroup","evaluateConstraints",pcVar10);
          std::__cxx11::string::~string(local_398);
          local_1 = 0;
          std::__cxx11::ostringstream::~ostringstream(local_370);
        }
        else {
          p_Var5 = &std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                  *)in_stack_fffffffffffffb30)->
                    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
          ;
          std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
          get(p_Var5);
          this_00 = std::
                    __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x397330);
          sVar11 = Constraint::constraintSize(this_00);
          if (sVar11 < *(uint *)(*in_RDI + 0x278)) {
            p_Var5 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)in_stack_fffffffffffffb30)->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var5);
            toEigen(in_stack_fffffffffffffb48);
            toEigen(in_stack_fffffffffffffb48);
            p_Var5 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)in_stack_fffffffffffffb30)->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var5);
            iDynTree::VectorDynSize::size();
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::segment<unsigned_long>
                      (local_18,(Index)peVar6,(unsigned_long)in_stack_fffffffffffffb48);
            Eigen::
            Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>::
            operator=(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
            toEigen(in_stack_fffffffffffffb48);
            this_01 = (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
                       *)(ulong)*(uint *)(*in_RDI + 0x278);
            p_Var5 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)this_01)->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var5);
            iDynTree::VectorDynSize::size();
            Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::tail<unsigned_long>(local_18,(unsigned_long)peVar6);
            Eigen::
            DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_false>_>
            ::setZero(this_01);
          }
          else {
            p_Var5 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)in_stack_fffffffffffffb30)->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            peVar7 = std::
                     __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                     ::get(p_Var5);
            iDynTree::VectorDynSize::operator=(local_30,&peVar7->constraintBuffer);
          }
          local_1 = 1;
        }
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ConstraintsGroup::evaluateConstraints(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraints)
        {
            if (isAnyTimeGroup()) {
                if (!(m_pimpl->group.begin()->second.get()->constraint->evaluateConstraint(time, state, control, constraints))) {
                    return false;
                }
                if (constraints.size() > m_pimpl->maxConstraintSize) {
                    std::ostringstream errorMsg;
                    errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                    reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                    return false;
                }
                return true;
            }

            if (constraints.size() < m_pimpl->maxConstraintSize) {
                constraints.resize(m_pimpl->maxConstraintSize);
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()) { //it means that there are no constraints at that time, what should be the constraint value?
                constraints.zero();
                return true;
            }
            
            if(!(constraintIterator->get()->constraint->evaluateConstraint(time, state, control, constraintIterator->get()->constraintBuffer))) {
                return false;
            }

            if (constraintIterator->get()->constraintBuffer.size() > m_pimpl->maxConstraintSize) {
                std::ostringstream errorMsg;
                errorMsg << "Constraint named "<<m_pimpl->group.begin()->first<< "output a vector bigger than the specified size.";
                reportError("ConstraintsGroup", "evaluateConstraints", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize) {
                toEigen(constraints).segment(0,constraintIterator->get()->constraintBuffer.size()) = toEigen(constraintIterator->get()->constraintBuffer);
                toEigen(constraints).tail(m_pimpl->maxConstraintSize - constraintIterator->get()->constraintBuffer.size()).setZero(); //append 0 at the end to equate the maxConstraintSize.
            } else {
                constraints = constraintIterator->get()->constraintBuffer;
            }

            return true;
        }